

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void ARGBToRGB565Row_C(uint8_t *src_argb,uint8_t *dst_rgb,int width)

{
  long lVar1;
  
  for (lVar1 = 0; (int)lVar1 < width + -1; lVar1 = lVar1 + 2) {
    *(uint *)(dst_rgb + lVar1 * 2) =
         (src_argb[lVar1 * 4 + 6] & 0xfffffff8) << 0x18 |
         (src_argb[lVar1 * 4 + 5] & 0xfc) << 0x13 |
         (src_argb[lVar1 * 4 + 4] & 0xf8) << 0xd |
         (src_argb[lVar1 * 4 + 2] & 0xf8) << 8 |
         (uint)(src_argb[lVar1 * 4] >> 3) + (src_argb[lVar1 * 4 + 1] & 0xfc) * 8;
  }
  if ((width & 1U) != 0) {
    *(ushort *)(dst_rgb + lVar1 * 2) =
         (src_argb[lVar1 * 4 + 2] & 0xfff8) << 8 |
         (ushort)(src_argb[lVar1 * 4] >> 3) + (src_argb[lVar1 * 4 + 1] & 0xfc) * 8;
  }
  return;
}

Assistant:

void ARGBToRGB565Row_C(const uint8_t* src_argb, uint8_t* dst_rgb, int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    uint8_t b0 = src_argb[0] >> 3;
    uint8_t g0 = src_argb[1] >> 2;
    uint8_t r0 = src_argb[2] >> 3;
    uint8_t b1 = src_argb[4] >> 3;
    uint8_t g1 = src_argb[5] >> 2;
    uint8_t r1 = src_argb[6] >> 3;
    WRITEWORD(dst_rgb, b0 | (g0 << 5) | (r0 << 11) | (b1 << 16) | (g1 << 21) |
                           (r1 << 27));
    dst_rgb += 4;
    src_argb += 8;
  }
  if (width & 1) {
    uint8_t b0 = src_argb[0] >> 3;
    uint8_t g0 = src_argb[1] >> 2;
    uint8_t r0 = src_argb[2] >> 3;
    *(uint16_t*)(dst_rgb) = b0 | (g0 << 5) | (r0 << 11);
  }
}